

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

int __thiscall
cmMakefile::TryCompile
          (cmMakefile *this,string *srcdir,string *bindir,string *projectName,string *targetName,
          bool fast,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmakeArgs,string *output)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  cmGlobalGenerator *pcVar5;
  cmake *pcVar6;
  string *psVar7;
  cmGlobalGenerator *gen;
  allocator local_4d1;
  int ret;
  allocator local_4a9;
  string local_4a8;
  allocator local_481;
  string local_480;
  allocator local_459;
  string local_458;
  allocator local_431;
  string local_430;
  allocator local_409;
  string local_408;
  allocator local_3e1;
  string local_3e0;
  char *local_3c0;
  char *config;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  cmGlobalGenerator *local_330;
  cmGlobalGenerator *gg;
  undefined1 local_318 [8];
  cmake cm;
  cmWorkingDirectory workdir;
  bool fast_local;
  string *targetName_local;
  string *projectName_local;
  string *bindir_local;
  string *srcdir_local;
  cmMakefile *this_local;
  
  this->IsSourceFileTryCompile = fast;
  bVar1 = cmsys::SystemTools::FileIsDirectory(bindir);
  if (!bVar1) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(pcVar4);
  }
  cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)&cm.Debugger,bindir);
  cmake::cmake((cmake *)local_318,RoleProject);
  cmake::SetIsInTryCompile((cmake *)local_318,true);
  pcVar5 = GetGlobalGenerator(this);
  (*pcVar5->_vptr_cmGlobalGenerator[3])(&local_350);
  pcVar5 = cmake::CreateGlobalGenerator((cmake *)local_318,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  local_330 = pcVar5;
  if (pcVar5 == (cmGlobalGenerator *)0x0) {
    pcVar5 = GetGlobalGenerator(this);
    (*pcVar5->_vptr_cmGlobalGenerator[3])(&local_3b0);
    std::operator+(&local_390,"Global generator \'",&local_3b0);
    std::operator+(&local_370,&local_390,"\' could not be created.");
    IssueMessage(this,INTERNAL_ERROR,&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    this_local._4_4_ = 1;
  }
  else {
    cmake::SetGlobalGenerator((cmake *)local_318,pcVar5);
    cmake::SetHomeDirectory((cmake *)local_318,srcdir);
    cmake::SetHomeOutputDirectory((cmake *)local_318,bindir);
    pcVar6 = GetCMakeInstance(this);
    psVar7 = cmake::GetGeneratorPlatform_abi_cxx11_(pcVar6);
    cmake::SetGeneratorPlatform((cmake *)local_318,psVar7);
    pcVar6 = GetCMakeInstance(this);
    psVar7 = cmake::GetGeneratorToolset_abi_cxx11_(pcVar6);
    cmake::SetGeneratorToolset((cmake *)local_318,psVar7);
    cmake::LoadCache((cmake *)local_318);
    uVar2 = (*local_330->_vptr_cmGlobalGenerator[0x1f])();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3e0,"CMAKE_TRY_COMPILE_CONFIGURATION",&local_3e1);
      pcVar4 = GetDefinition(this,&local_3e0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
      local_3c0 = pcVar4;
      if (pcVar4 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_408,"CMAKE_BUILD_TYPE",&local_409);
        cmake::AddCacheEntry((cmake *)local_318,&local_408,local_3c0,"Build configuration",3);
        std::__cxx11::string::~string((string *)&local_408);
        std::allocator<char>::~allocator((allocator<char> *)&local_409);
      }
    }
    if (cmakeArgs !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      cmake::SetWarnUnusedCli((cmake *)local_318,false);
      cmake::SetCacheArgs((cmake *)local_318,cmakeArgs);
    }
    pcVar5 = local_330;
    gen = GetGlobalGenerator(this);
    cmGlobalGenerator::EnableLanguagesFromGenerator(pcVar5,gen,this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_430,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_431);
    bVar1 = IsOn(this,&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_458,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_459);
      cmake::AddCacheEntry((cmake *)local_318,&local_458,"TRUE","",4);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator((allocator<char> *)&local_459);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_480,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_481);
      cmake::AddCacheEntry((cmake *)local_318,&local_480,"FALSE","",4);
      std::__cxx11::string::~string((string *)&local_480);
      std::allocator<char>::~allocator((allocator<char> *)&local_481);
    }
    iVar3 = cmake::Configure((cmake *)local_318);
    if (iVar3 == 0) {
      iVar3 = cmake::Generate((cmake *)local_318);
      if (iVar3 == 0) {
        pcVar5 = GetGlobalGenerator(this);
        this_local._4_4_ =
             cmGlobalGenerator::TryCompile
                       (pcVar5,srcdir,bindir,projectName,targetName,fast,output,this);
        this->IsSourceFileTryCompile = false;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&ret,"Failed to generate test project build system.",&local_4d1);
        IssueMessage(this,FATAL_ERROR,(string *)&ret);
        std::__cxx11::string::~string((string *)&ret);
        std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
        cmSystemTools::SetFatalErrorOccured();
        this->IsSourceFileTryCompile = false;
        this_local._4_4_ = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_4a8,"Failed to configure test project build system.",&local_4a9);
      IssueMessage(this,FATAL_ERROR,&local_4a8);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
      cmSystemTools::SetFatalErrorOccured();
      this->IsSourceFileTryCompile = false;
      this_local._4_4_ = 1;
    }
  }
  config._4_4_ = 1;
  cmake::~cmake((cmake *)local_318);
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)&cm.Debugger);
  return this_local._4_4_;
}

Assistant:

int cmMakefile::TryCompile(const std::string& srcdir,
                           const std::string& bindir,
                           const std::string& projectName,
                           const std::string& targetName, bool fast,
                           const std::vector<std::string>* cmakeArgs,
                           std::string& output)
{
  this->IsSourceFileTryCompile = fast;
  // does the binary directory exist ? If not create it...
  if (!cmSystemTools::FileIsDirectory(bindir)) {
    cmSystemTools::MakeDirectory(bindir.c_str());
  }

  // change to the tests directory and run cmake
  // use the cmake object instead of calling cmake
  cmWorkingDirectory workdir(bindir);

  // make sure the same generator is used
  // use this program as the cmake to be run, it should not
  // be run that way but the cmake object requires a vailid path
  cmake cm(cmake::RoleProject);
  cm.SetIsInTryCompile(true);
  cmGlobalGenerator* gg =
    cm.CreateGlobalGenerator(this->GetGlobalGenerator()->GetName());
  if (!gg) {
    this->IssueMessage(cmake::INTERNAL_ERROR, "Global generator '" +
                         this->GetGlobalGenerator()->GetName() +
                         "' could not be created.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }
  cm.SetGlobalGenerator(gg);

  // do a configure
  cm.SetHomeDirectory(srcdir);
  cm.SetHomeOutputDirectory(bindir);
  cm.SetGeneratorPlatform(this->GetCMakeInstance()->GetGeneratorPlatform());
  cm.SetGeneratorToolset(this->GetCMakeInstance()->GetGeneratorToolset());
  cm.LoadCache();
  if (!gg->IsMultiConfig()) {
    if (const char* config =
          this->GetDefinition("CMAKE_TRY_COMPILE_CONFIGURATION")) {
      // Tell the single-configuration generator which one to use.
      // Add this before the user-provided CMake arguments in case
      // one of the arguments is -DCMAKE_BUILD_TYPE=...
      cm.AddCacheEntry("CMAKE_BUILD_TYPE", config, "Build configuration",
                       cmStateEnums::STRING);
    }
  }
  // if cmake args were provided then pass them in
  if (cmakeArgs) {
    // FIXME: Workaround to ignore unused CLI variables in try-compile.
    //
    // Ideally we should use SetArgs to honor options like --warn-unused-vars.
    // However, there is a subtle problem when certain arguments are passed to
    // a macro wrapping around try_compile or try_run that does not escape
    // semicolons in its parameters but just passes ${ARGV} or ${ARGN}.  In
    // this case a list argument like "-DVAR=a;b" gets split into multiple
    // cmake arguments "-DVAR=a" and "b".  Currently SetCacheArgs ignores
    // argument "b" and uses just "-DVAR=a", leading to a subtle bug in that
    // the try_compile or try_run does not get the proper value of VAR.  If we
    // call SetArgs here then it would treat "b" as the source directory and
    // cause an error such as "The source directory .../CMakeFiles/CMakeTmp/b
    // does not exist", thus breaking the try_compile or try_run completely.
    //
    // Strictly speaking the bug is in the wrapper macro because the CMake
    // language has always flattened nested lists and the macro should escape
    // the semicolons in its arguments before forwarding them.  However, this
    // bug is so subtle that projects typically work anyway, usually because
    // the value VAR=a is sufficient for the try_compile or try_run to get the
    // correct result.  Calling SetArgs here would break such projects that
    // previously built.  Instead we work around the issue by never reporting
    // unused arguments and ignoring options such as --warn-unused-vars.
    cm.SetWarnUnusedCli(false);
    // cm.SetArgs(*cmakeArgs, true);

    cm.SetCacheArgs(*cmakeArgs);
  }
  // to save time we pass the EnableLanguage info directly
  gg->EnableLanguagesFromGenerator(this->GetGlobalGenerator(), this);
  if (this->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "TRUE", "",
                     cmStateEnums::INTERNAL);
  } else {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "FALSE", "",
                     cmStateEnums::INTERNAL);
  }
  if (cm.Configure() != 0) {
    this->IssueMessage(cmake::FATAL_ERROR,
                       "Failed to configure test project build system.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  if (cm.Generate() != 0) {
    this->IssueMessage(cmake::FATAL_ERROR,
                       "Failed to generate test project build system.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // finally call the generator to actually build the resulting project
  int ret = this->GetGlobalGenerator()->TryCompile(
    srcdir, bindir, projectName, targetName, fast, output, this);

  this->IsSourceFileTryCompile = false;
  return ret;
}